

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int pk_parse_key_sec1_der(mbedtls_ecp_keypair *eck,uchar *key,size_t keylen)

{
  mbedtls_mpi *X;
  int iVar1;
  uchar *puVar2;
  uchar *p;
  size_t len;
  int version;
  mbedtls_asn1_buf params;
  uchar *local_50;
  size_t local_48;
  int local_3c;
  mbedtls_asn1_buf local_38;
  
  local_50 = key;
  iVar1 = mbedtls_asn1_get_tag(&local_50,key + keylen,&local_48,0x30);
  if (iVar1 != 0) goto LAB_0010cae7;
  puVar2 = local_50 + local_48;
  iVar1 = mbedtls_asn1_get_int(&local_50,puVar2,&local_3c);
  if (iVar1 != 0) goto LAB_0010cae7;
  if (local_3c != 1) {
    return -0x3d80;
  }
  iVar1 = mbedtls_asn1_get_tag(&local_50,puVar2,&local_48,4);
  if (iVar1 != 0) goto LAB_0010cae7;
  X = &eck->d;
  iVar1 = mbedtls_mpi_read_binary(X,local_50,local_48);
  if (iVar1 == 0) {
    local_50 = local_50 + local_48;
    if ((local_50 != puVar2) &&
       (iVar1 = mbedtls_asn1_get_tag(&local_50,puVar2,&local_48,0xa0), iVar1 != -0x62)) {
      if (iVar1 != 0) goto LAB_0010cb40;
      iVar1 = pk_get_ecparams(&local_50,local_50 + local_48,&local_38);
      if ((iVar1 != 0) || (iVar1 = pk_use_ecparams(&local_38,&eck->grp), iVar1 != 0))
      goto LAB_0010cc75;
    }
    if ((local_50 == puVar2) ||
       (iVar1 = mbedtls_asn1_get_tag(&local_50,puVar2,&local_48,0xa1), iVar1 == -0x62)) {
LAB_0010cc42:
      iVar1 = mbedtls_ecp_mul(&eck->grp,&eck->Q,X,&(eck->grp).G,
                              (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0);
      if (iVar1 == 0) {
LAB_0010cc66:
        iVar1 = mbedtls_ecp_check_privkey(&eck->grp,X);
        if (iVar1 == 0) {
          return 0;
        }
LAB_0010cc75:
        mbedtls_ecp_keypair_free(eck);
        return iVar1;
      }
    }
    else if (iVar1 == 0) {
      puVar2 = local_50 + local_48;
      iVar1 = mbedtls_asn1_get_bitstring_null(&local_50,puVar2,&local_48);
      if (iVar1 != 0) goto LAB_0010cae7;
      if (local_50 + local_48 != puVar2) {
        return -0x3d66;
      }
      iVar1 = pk_get_ecpubkey(&local_50,puVar2,eck);
      if (iVar1 == -0x4e80) goto LAB_0010cc42;
      if (iVar1 != 0) {
        return -0x3d00;
      }
      goto LAB_0010cc66;
    }
  }
LAB_0010cb40:
  mbedtls_ecp_keypair_free(eck);
LAB_0010cae7:
  return iVar1 + -0x3d00;
}

Assistant:

static int pk_parse_key_sec1_der( mbedtls_ecp_keypair *eck,
                                  const unsigned char *key,
                                  size_t keylen )
{
    int ret;
    int version, pubkey_done;
    size_t len;
    mbedtls_asn1_buf params;
    unsigned char *p = (unsigned char *) key;
    unsigned char *end = p + keylen;
    unsigned char *end2;

    /*
     * RFC 5915, or SEC1 Appendix C.4
     *
     * ECPrivateKey ::= SEQUENCE {
     *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
     *      privateKey     OCTET STRING,
     *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
     *      publicKey  [1] BIT STRING OPTIONAL
     *    }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_int( &p, end, &version ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( version != 1 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_VERSION );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( ( ret = mbedtls_mpi_read_binary( &eck->d, p, len ) ) != 0 )
    {
        mbedtls_ecp_keypair_free( eck );
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    p += len;

    pubkey_done = 0;
    if( p != end )
    {
        /*
         * Is 'parameters' present?
         */
        if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) ) == 0 )
        {
            if( ( ret = pk_get_ecparams( &p, p + len, &params) ) != 0 ||
                ( ret = pk_use_ecparams( &params, &eck->grp )  ) != 0 )
            {
                mbedtls_ecp_keypair_free( eck );
                return( ret );
            }
        }
        else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        {
            mbedtls_ecp_keypair_free( eck );
            return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
        }
    }

    if( p != end )
    {
        /*
         * Is 'publickey' present? If not, or if we can't read it (eg because it
         * is compressed), create it from the private key.
         */
        if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) ) == 0 )
        {
            end2 = p + len;

            if( ( ret = mbedtls_asn1_get_bitstring_null( &p, end2, &len ) ) != 0 )
                return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

            if( p + len != end2 )
                return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT +
                        MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

            if( ( ret = pk_get_ecpubkey( &p, end2, eck ) ) == 0 )
                pubkey_done = 1;
            else
            {
                /*
                 * The only acceptable failure mode of pk_get_ecpubkey() above
                 * is if the point format is not recognized.
                 */
                if( ret != MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE )
                    return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
            }
        }
        else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        {
            mbedtls_ecp_keypair_free( eck );
            return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
        }
    }

    if( ! pubkey_done &&
        ( ret = mbedtls_ecp_mul( &eck->grp, &eck->Q, &eck->d, &eck->grp.G,
                                                      NULL, NULL ) ) != 0 )
    {
        mbedtls_ecp_keypair_free( eck );
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    if( ( ret = mbedtls_ecp_check_privkey( &eck->grp, &eck->d ) ) != 0 )
    {
        mbedtls_ecp_keypair_free( eck );
        return( ret );
    }

    return( 0 );
}